

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_operator_subscript_Test::TestBody
          (test_matrix_sparse_operator_subscript_Test *this)

{
  initializer_list<double> value;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  bool bVar1;
  int iVar2;
  uint uVar3;
  Scalar *pSVar4;
  char *pcVar5;
  char *regex;
  AssertHelper local_318;
  Message local_310;
  int local_304;
  exception *gtest_exception;
  size_t local_2d0;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_2c8;
  ReturnSentinel local_2b8;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_290;
  DeathTest *gtest_dt;
  Message local_280;
  size_t local_278 [2];
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_268;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_4;
  Message local_240;
  size_t local_238 [2];
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_228;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_3;
  Message local_200;
  size_t local_1f8 [2];
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_1e8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_2;
  Matrix_Sparse matrix_1;
  undefined1 local_168 [48];
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110;
  pointer local_108 [3];
  size_t local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  pointer local_a8;
  size_t local_a0;
  pointer *local_98;
  undefined8 local_90;
  unsigned_long local_88 [3];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse matrix_0;
  test_matrix_sparse_operator_subscript_Test *this_local;
  
  local_88[0] = 0;
  local_88[1] = 1;
  local_88[2] = 2;
  local_70 = local_88;
  local_68 = 3;
  local_a8 = (pointer)0x0;
  local_a0 = 1;
  local_98 = &local_a8;
  local_90 = 2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  non_zero._M_len = 3;
  non_zero._M_array = local_70;
  index._M_len = 2;
  index._M_array = (iterator)local_98;
  value._M_len = 2;
  value._M_array = (iterator)&gtest_ar.message_;
  matrix_0.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero,index,value,2);
  local_f0 = 0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_e8,(size_t *)local_60);
  local_108[0] = (pointer)0x0;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_e8,(size_t *)local_108);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_d8,"matrix_0[0][0]","1.0",*pSVar4,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x62,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_168._40_8_ = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_138,(size_t *)local_60);
  local_168._32_8_ = (pointer)0x1;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_138,
                      (size_t *)(local_168 + 0x20));
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"matrix_0[1][1]","2.0",*pSVar4,2.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)(local_168 + 0x18));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_168 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_168 + 0x10),(Message *)(local_168 + 0x18));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_168 + 0x10));
    testing::Message::~Message((Message *)(local_168 + 0x18));
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_168,(size_t *)local_60);
  matrix_1.column_size = 1;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_168,&matrix_1.column_size);
  *pSVar4 = 3.0;
  Disa::Matrix_Sparse::Matrix_Sparse
            ((Matrix_Sparse *)&gtest_ar_2.message_,(Matrix_Sparse *)local_60);
  local_1f8[1] = 0;
  local_1e8 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)&gtest_ar_2.message_,local_1f8 + 1);
  local_1f8[0] = 0;
  pSVar4 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[](&local_1e8,local_1f8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"matrix_1[0][0]","1.0",*pSVar4,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x67,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_238[1] = 0;
  local_228 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)&gtest_ar_2.message_,local_238 + 1);
  local_238[0] = 1;
  pSVar4 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[](&local_228,local_238);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_218,"matrix_1[0][1]","3.0",*pSVar4,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x68,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_278[1] = 1;
  local_268 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)&gtest_ar_2.message_,local_278 + 1);
  local_278[0] = 1;
  pSVar4 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[](&local_268,local_278);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_258,"matrix_1[1][1]","2.0",*pSVar4,2.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x69,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("matrix_1[1][0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x6c,&local_290);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_290 == (pointer)0x0) goto LAB_00118e2a;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_290);
      iVar2 = (*local_290->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_290->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_290->_vptr_DeathTest[4])(local_290,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00118d3b;
        local_304 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_2b8,local_290);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_2d0 = 1;
            local_2c8 = Disa::Matrix_Sparse::operator[]
                                  ((Matrix_Sparse *)&gtest_ar_2.message_,&local_2d0);
            gtest_exception = (exception *)0x0;
            Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                      (&local_2c8,(size_t *)&gtest_exception);
          }
          (*local_290->_vptr_DeathTest[5])(local_290,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_2b8);
        }
LAB_00118d3b:
        local_304 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_304 == 0) goto LAB_00118e2a;
    }
  }
  testing::Message::Message(&local_310);
  pcVar5 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_318,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x6c,pcVar5);
  testing::internal::AssertHelper::operator=(&local_318,&local_310);
  testing::internal::AssertHelper::~AssertHelper(&local_318);
  testing::Message::~Message(&local_310);
LAB_00118e2a:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)&gtest_ar_2.message_);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_subscript) {
  Matrix_Sparse matrix_0({0, 1, 2}, {0, 1}, {1.0, 2.0}, 2);

  EXPECT_DOUBLE_EQ(matrix_0[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_0[1][1], 2.0);
  matrix_0[0][1] = 3.0;  // this should insert a new element.

  const Matrix_Sparse matrix_1 = matrix_0;
  EXPECT_DOUBLE_EQ(matrix_1[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_1[0][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix_1[1][1], 2.0);

  // Check debug for const matrix.
  EXPECT_DEATH(matrix_1[1][0], "./*");
}